

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawIndexedTest.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::Draw::anon_unknown_10::DrawIndexed::iterate
          (TestStatus *__return_storage_ptr__,DrawIndexed *this)

{
  DeviceInterface *pDVar1;
  VkCommandBuffer_s *pVVar2;
  VkOffset3D offset;
  qpTestResult code;
  VkQueue log_00;
  bool bVar3;
  VkResult VVar4;
  int iVar5;
  int iVar6;
  TestContext *this_00;
  size_type sVar7;
  VkDevice pVVar8;
  Allocator *pAVar9;
  Buffer *pBVar10;
  void *dst;
  reference src;
  VkDeviceSize VVar11;
  VkBuffer VVar12;
  VkCommandBuffer_s **ppVVar13;
  Handle<(vk::HandleType)18> *pHVar14;
  PixelBufferAccess *pPVar15;
  Image *this_01;
  ConstPixelBufferAccess *reference;
  char *__s;
  Move<vk::VkCommandBuffer_s_*> *this_02;
  float fVar16;
  float fVar17;
  allocator<char> local_2b1;
  string local_2b0;
  qpTestResult local_28c;
  void *pvStack_288;
  qpTestResult res;
  deInt32 local_280;
  undefined1 local_278 [8];
  ConstPixelBufferAccess renderedFrame;
  VkOffset3D zeroOffset;
  int local_22c;
  float xCoord;
  int x;
  float yCoord;
  int y;
  ReferenceImageCoordinates refCoords;
  deInt32 frameHeight;
  deInt32 frameWidth;
  undefined1 local_1e0 [8];
  Texture2D referenceFrame;
  undefined8 uStack_188;
  VkSubmitInfo submitInfo;
  VkBuffer indexBuffer;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  Allocation local_f0;
  VkDeviceMemory local_d0;
  Allocation local_c8;
  void *local_a8;
  deUint8 *ptr;
  BufferCreateInfo local_90;
  SharedPtr<vkt::Draw::Buffer> local_40;
  Handle<(vk::HandleType)8> local_30;
  VkDeviceSize dataSize;
  VkQueue queue;
  TestLog *log;
  DrawIndexed *this_local;
  
  log = (TestLog *)this;
  this_local = (DrawIndexed *)__return_storage_ptr__;
  this_00 = Context::getTestContext((this->super_DrawTestsBaseClass).super_TestInstance.m_context);
  queue = (VkQueue)tcu::TestContext::getLog(this_00);
  dataSize = (VkDeviceSize)
             Context::getUniversalQueue
                       ((this->super_DrawTestsBaseClass).super_TestInstance.m_context);
  DrawTestsBaseClass::beginRenderPass(&this->super_DrawTestsBaseClass);
  sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_indexes);
  local_30.m_internal = sVar7 << 2;
  pDVar1 = (this->super_DrawTestsBaseClass).m_vk;
  pVVar8 = Context::getDevice((this->super_DrawTestsBaseClass).super_TestInstance.m_context);
  BufferCreateInfo::BufferCreateInfo
            (&local_90,local_30.m_internal,0x40,VK_SHARING_MODE_EXCLUSIVE,0,(deUint32 *)0x0,0);
  pAVar9 = Context::getDefaultAllocator
                     ((this->super_DrawTestsBaseClass).super_TestInstance.m_context);
  ptr._0_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  Draw::Buffer::createAndAlloc
            ((Buffer *)&local_40,pDVar1,pVVar8,&local_90.super_VkBufferCreateInfo,pAVar9,
             ::vk::MemoryRequirement::HostVisible);
  de::SharedPtr<vkt::Draw::Buffer>::operator=(&this->m_indexBuffer,&local_40);
  de::SharedPtr<vkt::Draw::Buffer>::~SharedPtr(&local_40);
  BufferCreateInfo::~BufferCreateInfo(&local_90);
  pBVar10 = de::SharedPtr<vkt::Draw::Buffer>::operator->(&this->m_indexBuffer);
  Draw::Buffer::getBoundMemory(&local_c8,pBVar10);
  dst = ::vk::Allocation::getHostPtr(&local_c8);
  ::vk::Allocation::~Allocation(&local_c8);
  local_a8 = dst;
  src = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&this->m_indexes,0);
  ::deMemcpy(dst,src,local_30.m_internal);
  pDVar1 = (this->super_DrawTestsBaseClass).m_vk;
  pVVar8 = Context::getDevice((this->super_DrawTestsBaseClass).super_TestInstance.m_context);
  pBVar10 = de::SharedPtr<vkt::Draw::Buffer>::operator->(&this->m_indexBuffer);
  Draw::Buffer::getBoundMemory(&local_f0,pBVar10);
  local_d0 = ::vk::Allocation::getMemory(&local_f0);
  pBVar10 = de::SharedPtr<vkt::Draw::Buffer>::operator->(&this->m_indexBuffer);
  Draw::Buffer::getBoundMemory((Allocation *)&vertexBufferOffset,pBVar10);
  VVar11 = ::vk::Allocation::getOffset((Allocation *)&vertexBufferOffset);
  ::vk::flushMappedMemoryRange(pDVar1,pVVar8,local_d0,VVar11,local_30.m_internal);
  ::vk::Allocation::~Allocation((Allocation *)&vertexBufferOffset);
  ::vk::Allocation::~Allocation(&local_f0);
  vertexBuffer.m_internal = 0;
  pBVar10 = de::SharedPtr<vkt::Draw::Buffer>::operator->
                      (&(this->super_DrawTestsBaseClass).m_vertexBuffer);
  indexBuffer = Draw::Buffer::object(pBVar10);
  pBVar10 = de::SharedPtr<vkt::Draw::Buffer>::operator->(&this->m_indexBuffer);
  VVar12 = Draw::Buffer::object(pBVar10);
  pDVar1 = (this->super_DrawTestsBaseClass).m_vk;
  this_02 = &(this->super_DrawTestsBaseClass).m_cmdBuffer;
  ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&this_02->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x58])(pDVar1,*ppVVar13,0,1,&indexBuffer,&vertexBuffer);
  pDVar1 = (this->super_DrawTestsBaseClass).m_vk;
  ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&this_02->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x57])(pDVar1,*ppVVar13,VVar12.m_internal,0,1);
  pDVar1 = (this->super_DrawTestsBaseClass).m_vk;
  ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&this_02->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar2 = *ppVVar13;
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      (&(this->super_DrawTestsBaseClass).m_pipeline.
                        super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  (*pDVar1->_vptr_DeviceInterface[0x4c])(pDVar1,pVVar2,0,pHVar14->m_internal);
  pDVar1 = (this->super_DrawTestsBaseClass).m_vk;
  ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&this_02->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x5a])(pDVar1,*ppVVar13,6,1,2,0xd,0);
  pDVar1 = (this->super_DrawTestsBaseClass).m_vk;
  ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&this_02->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x76])(pDVar1,*ppVVar13);
  pDVar1 = (this->super_DrawTestsBaseClass).m_vk;
  ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&this_02->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x4a])(pDVar1,*ppVVar13);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_188 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 (&this_02->super_RefBase<vk::VkCommandBuffer_s_*>);
  VVar11 = dataSize;
  pDVar1 = (this->super_DrawTestsBaseClass).m_vk;
  ::vk::Handle<(vk::HandleType)6>::Handle
            ((Handle<(vk::HandleType)6> *)&referenceFrame.m_view.m_levels,0);
  VVar4 = (*pDVar1->_vptr_DeviceInterface[2])(pDVar1,VVar11,1,&uStack_188);
  ::vk::checkResult(VVar4,"m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndexedTest.cpp"
                    ,0xb8);
  pDVar1 = (this->super_DrawTestsBaseClass).m_vk;
  VVar4 = (*pDVar1->_vptr_DeviceInterface[3])(pDVar1,dataSize);
  ::vk::checkResult(VVar4,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndexedTest.cpp"
                    ,0xba);
  _frameHeight = ::vk::mapVkFormat((this->super_DrawTestsBaseClass).m_colorAttachmentFormat);
  tcu::Texture2D::Texture2D((Texture2D *)local_1e0,(TextureFormat *)&frameHeight,0x100,0x100);
  tcu::Texture2D::allocLevel((Texture2D *)local_1e0,0);
  iVar5 = tcu::Texture2D::getWidth((Texture2D *)local_1e0);
  iVar6 = tcu::Texture2D::getHeight((Texture2D *)local_1e0);
  pPVar15 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_1e0,0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&refCoords.bottom,0.0,0.0,0.0,1.0);
  tcu::clear(pPVar15,(Vec4 *)&refCoords.bottom);
  ReferenceImageCoordinates::ReferenceImageCoordinates((ReferenceImageCoordinates *)&yCoord);
  for (x = 0; x < iVar6; x = x + 1) {
    fVar16 = (float)x / ((float)iVar6 * 0.5) - 1.0;
    for (local_22c = 0; local_22c < iVar5; local_22c = local_22c + 1) {
      fVar17 = (float)local_22c / ((float)iVar5 * 0.5) - 1.0;
      if ((((refCoords.top <= (double)fVar16) && ((double)fVar16 <= refCoords.right)) &&
          (_yCoord <= (double)fVar17)) && ((double)fVar17 <= refCoords.left)) {
        pPVar15 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_1e0,0);
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&zeroOffset.z,0.0,0.0,1.0,1.0);
        tcu::PixelBufferAccess::setPixel(pPVar15,(Vec4 *)&zeroOffset.z,local_22c,x,0);
      }
    }
  }
  zeroOffset.x = 0;
  renderedFrame.m_data = (void *)0x0;
  this_01 = de::SharedPtr<vkt::Draw::Image>::operator->
                      (&(this->super_DrawTestsBaseClass).m_colorTargetImage);
  VVar11 = dataSize;
  pAVar9 = Context::getDefaultAllocator
                     ((this->super_DrawTestsBaseClass).super_TestInstance.m_context);
  local_280 = zeroOffset.x;
  pvStack_288 = renderedFrame.m_data;
  offset.z = zeroOffset.x;
  offset._0_8_ = renderedFrame.m_data;
  Draw::Image::readSurface
            ((ConstPixelBufferAccess *)local_278,this_01,(VkQueue)VVar11,pAVar9,
             VK_IMAGE_LAYOUT_GENERAL,offset,0x100,0x100,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  log_00 = queue;
  local_28c = QP_TEST_RESULT_PASS;
  reference = &tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_1e0,0)->
               super_ConstPixelBufferAccess;
  bVar3 = tcu::fuzzyCompare((TestLog *)log_00,"Result","Image comparison result",reference,
                            (ConstPixelBufferAccess *)local_278,0.05,COMPARE_LOG_RESULT);
  if (!bVar3) {
    local_28c = QP_TEST_RESULT_FAIL;
  }
  code = local_28c;
  __s = qpGetTestResultName(local_28c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,__s,&local_2b1);
  tcu::TestStatus::TestStatus(__return_storage_ptr__,code,&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  tcu::Texture2D::~Texture2D((Texture2D *)local_1e0);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus DrawIndexed::iterate (void)
{
	tcu::TestLog &log			= m_context.getTestContext().getLog();
	const vk::VkQueue queue		= m_context.getUniversalQueue();

	beginRenderPass();

	const vk::VkDeviceSize dataSize = m_indexes.size() * sizeof(deUint32);
	m_indexBuffer = Buffer::createAndAlloc(	m_vk, m_context.getDevice(),
											BufferCreateInfo(dataSize,
															 vk::VK_BUFFER_USAGE_INDEX_BUFFER_BIT),
											m_context.getDefaultAllocator(),
											vk::MemoryRequirement::HostVisible);

	deUint8* ptr = reinterpret_cast<deUint8*>(m_indexBuffer->getBoundMemory().getHostPtr());

	deMemcpy(ptr, &m_indexes[0], static_cast<size_t>(dataSize));

	vk::flushMappedMemoryRange(m_vk, m_context.getDevice(),
							   m_indexBuffer->getBoundMemory().getMemory(),
							   m_indexBuffer->getBoundMemory().getOffset(),
							   dataSize);

	const vk::VkDeviceSize vertexBufferOffset = 0;
	const vk::VkBuffer vertexBuffer = m_vertexBuffer->object();
	const vk::VkBuffer indexBuffer = m_indexBuffer->object();

	m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);
	m_vk.cmdBindIndexBuffer(*m_cmdBuffer, indexBuffer, 0, vk::VK_INDEX_TYPE_UINT32);

	m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);

	m_vk.cmdDrawIndexed(*m_cmdBuffer, 6, 1, 2, VERTEX_OFFSET, 0);

	m_vk.cmdEndRenderPass(*m_cmdBuffer);
	m_vk.endCommandBuffer(*m_cmdBuffer);

	vk::VkSubmitInfo submitInfo =
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
		DE_NULL,							// const void*				pNext;
		0,										// deUint32					waitSemaphoreCount;
		DE_NULL,								// const VkSemaphore*		pWaitSemaphores;
		(const vk::VkPipelineStageFlags*)DE_NULL,
		1,										// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),					// const VkCommandBuffer*	pCommandBuffers;
		0,										// deUint32					signalSemaphoreCount;
		DE_NULL								// const VkSemaphore*		pSignalSemaphores;
	};

	VK_CHECK(m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL));

	VK_CHECK(m_vk.queueWaitIdle(queue));

	// Validation
	tcu::Texture2D referenceFrame(vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));
								  referenceFrame.allocLevel(0);

	const deInt32 frameWidth	= referenceFrame.getWidth();
	const deInt32 frameHeight	= referenceFrame.getHeight();

	tcu::clear(referenceFrame.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	ReferenceImageCoordinates refCoords;

	for (int y = 0; y < frameHeight; y++)
	{
		const float yCoord = (float)(y / (0.5*frameHeight)) - 1.0f;

		for (int x = 0; x < frameWidth; x++)
		{
			const float xCoord = (float)(x / (0.5*frameWidth)) - 1.0f;

			if ((yCoord >= refCoords.bottom &&
				 yCoord <= refCoords.top	&&
				 xCoord >= refCoords.left	&&
				 xCoord <= refCoords.right))
				referenceFrame.getLevel(0).setPixel(tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f), x, y);
		}
	}

	const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
	const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
		vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

	qpTestResult res = QP_TEST_RESULT_PASS;

	if (!tcu::fuzzyCompare(log, "Result", "Image comparison result",
		referenceFrame.getLevel(0), renderedFrame, 0.05f,
		tcu::COMPARE_LOG_RESULT)) {
		res = QP_TEST_RESULT_FAIL;
	}

	return tcu::TestStatus(res, qpGetTestResultName(res));
}